

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  IfcStructuralSurfaceMember *this_00;
  long lVar1;
  void *pvVar2;
  
  lVar1 = *(long *)(*(long *)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                              super_IfcStructuralItem.super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralSurfaceMember *)
            (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
              super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x0 + lVar1);
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0x0 + lVar1) = 0x83ee88;
  *(undefined8 *)(&this->field_0x190 + lVar1) = 0x83efc8;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0x88 + lVar1) = 0x83eeb0;
  *(undefined8 *)
   ((long)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
           super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper + lVar1) =
       0x83eed8;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.super_IfcObject.field_0xd0 + lVar1) = 0x83ef00;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.field_0x100 + lVar1) = 0x83ef28;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     super_IfcProduct.field_0x110 + lVar1) = 0x83ef50;
  *(undefined8 *)
   (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
     field_0x120 + lVar1) = 0x83ef78;
  *(undefined8 *)(&(this->super_IfcStructuralSurfaceMember).field_0x160 + lVar1) = 0x83efa0;
  pvVar2 = *(void **)(&(this->super_IfcStructuralSurfaceMember).field_0x170 + lVar1);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this_00[1].super_IfcStructuralMember.super_IfcStructuralItem.
                                     super_IfcProduct.super_IfcObject.field_0x8 - (long)pvVar2);
  }
  IfcStructuralSurfaceMember::~IfcStructuralSurfaceMember
            (this_00,&PTR_construction_vtable_24__0083efe0);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}